

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLScanner::scanComment(XMLScanner *this)

{
  XMLDocumentHandler *pXVar1;
  XMLSize_t XVar2;
  bool bVar3;
  bool bVar4;
  XMLCh toAppend;
  UnexpectedEOFException *this_00;
  int iVar5;
  XMLBufBid bbComment;
  XMLCh tmpBuf [9];
  
  bbComment.fBuffer = XMLBufferMgr::bidOnBuffer(&this->fBufMgr);
  bVar3 = false;
  iVar5 = 0;
  bbComment.fMgr = &this->fBufMgr;
LAB_002c206d:
  do {
    toAppend = ReaderMgr::getNextChar(&this->fReaderMgr);
    if (toAppend == L'\0') {
      emitError(this,UnterminatedComment);
      this_00 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
      UnexpectedEOFException::UnexpectedEOFException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLScanner.cpp"
                 ,0x868,Gen_UnexpectedEOF,this->fMemoryManager);
      __cxa_throw(this_00,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
    }
    if ((toAppend & 0xfc00U) == 0xd800) {
      bVar4 = true;
      if (bVar3) {
        emitError(this,Expected2ndSurrogateChar);
        bVar4 = bVar3;
      }
    }
    else {
      if (bVar3) {
        if ((ushort)(toAppend + L'\x2000') < 0xfc00) {
          emitError(this,Expected2ndSurrogateChar);
        }
      }
      else if ((((this->fReaderMgr).fCurReader)->fgCharCharsTable[(ushort)toAppend] & 0x40) == 0) {
        XMLString::binToText((uint)(ushort)toAppend,tmpBuf,8,0x10,this->fMemoryManager);
        emitError(this,InvalidCharacter,tmpBuf,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      bVar4 = false;
    }
    bVar3 = bVar4;
    if (iVar5 == 0) goto LAB_002c2151;
    if (iVar5 != 1) {
      if (toAppend == L'>') {
        pXVar1 = this->fDocHandler;
        if (pXVar1 != (XMLDocumentHandler *)0x0) {
          (bbComment.fBuffer)->fBuffer[(bbComment.fBuffer)->fIndex] = L'\0';
          (*pXVar1->_vptr_XMLDocumentHandler[3])();
        }
        XVar2 = (this->fElemStack).fStackTop;
        if (XVar2 != 0) {
          (this->fElemStack).fStack[XVar2 - 1]->fCommentOrPISeen = true;
        }
      }
      else {
        emitError(this,IllegalSequenceInComment);
        ReaderMgr::skipPastChar(&this->fReaderMgr,L'>');
      }
      XMLBufBid::~XMLBufBid(&bbComment);
      return;
    }
    iVar5 = 2;
  } while (toAppend == L'-');
  XMLBuffer::append(bbComment.fBuffer,L'-');
  goto LAB_002c2162;
LAB_002c2151:
  iVar5 = 1;
  if (toAppend != L'-') {
LAB_002c2162:
    XMLBuffer::append(bbComment.fBuffer,toAppend);
    iVar5 = 0;
  }
  goto LAB_002c206d;
}

Assistant:

void XMLScanner::scanComment()
{

    enum States
    {
        InText
        , OneDash
        , TwoDashes
    };

    // Get a buffer for this
    XMLBufBid bbComment(&fBufMgr);

    //  Get the comment text into a temp buffer. Be sure to use temp buffer
    //  two here, since its to be used for stuff that is potentially longer
    //  than just a name.
    States curState = InText;
    bool gotLeadingSurrogate = false;
    while (true)
    {
        // Get the next character
        const XMLCh nextCh = fReaderMgr.getNextChar();

        //  Watch for an end of file
        if (!nextCh)
        {
            emitError(XMLErrs::UnterminatedComment);
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);
        }

        // Check for correct surrogate pairs
        if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
        {
            if (gotLeadingSurrogate)
                emitError(XMLErrs::Expected2ndSurrogateChar);
            else
                gotLeadingSurrogate = true;
        }
        else
        {
            if (gotLeadingSurrogate)
            {
                if ((nextCh < 0xDC00) || (nextCh > 0xDFFF))
                    emitError(XMLErrs::Expected2ndSurrogateChar);
            }
            // Its got to at least be a valid XML character
            else if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh)) {

                XMLCh tmpBuf[9];
                XMLString::binToText
                (
                    nextCh
                    , tmpBuf
                    , 8
                    , 16
                    , fMemoryManager
                );
                emitError(XMLErrs::InvalidCharacter, tmpBuf);
            }

            gotLeadingSurrogate = false;
        }

        if (curState == InText)
        {
            // If its a dash, go to OneDash state. Otherwise take as text
            if (nextCh == chDash)
                curState = OneDash;
            else
                bbComment.append(nextCh);
        }
        else if (curState == OneDash)
        {
            //  If its another dash, then we change to the two dashes states.
            //  Otherwise, we have to put in the deficit dash and the new
            //  character and go back to InText.
            if (nextCh == chDash)
            {
                curState = TwoDashes;
            }
            else
            {
                bbComment.append(chDash);
                bbComment.append(nextCh);
                curState = InText;
            }
        }
        else if (curState == TwoDashes)
        {
            // The next character must be the closing bracket
            if (nextCh != chCloseAngle)
            {
                emitError(XMLErrs::IllegalSequenceInComment);
                fReaderMgr.skipPastChar(chCloseAngle);
                return;
            }
            break;
        }
    }

    // If we have an available handler, call back with the comment.
    if (fDocHandler)
    {
        fDocHandler->docComment
        (
            bbComment.getRawBuffer()
        );
    }

    //mark comment is seen within the current element
    if (! fElemStack.isEmpty())
        fElemStack.setCommentOrPISeen();

}